

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.h
# Opt level: O0

void __thiscall
aeron::ClientConductor::ExclusivePublicationStateDefn::ExclusivePublicationStateDefn
          (ExclusivePublicationStateDefn *this,string *channel,int64_t registrationId,
          int32_t streamId,longlong now)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = in_RDX;
  *(undefined4 *)(in_RDI + 0x30) = in_ECX;
  *(undefined4 *)(in_RDI + 0x34) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x38) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3c) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x40) = in_R8;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  std::__cxx11::string::string(in_RDI + 0x50);
  std::shared_ptr<aeron::LogBuffers>::shared_ptr((shared_ptr<aeron::LogBuffers> *)0x2061c1);
  std::weak_ptr<aeron::ExclusivePublication>::weak_ptr
            ((weak_ptr<aeron::ExclusivePublication> *)0x2061d2);
  return;
}

Assistant:

ExclusivePublicationStateDefn(
            const std::string& channel, std::int64_t registrationId, std::int32_t streamId, long long now) :
            m_channel(channel),
            m_registrationId(registrationId),
            m_streamId(streamId),
            m_timeOfRegistration(now)
        {
        }